

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O0

void __thiscall Jupiter::Plugin::setConfigDirectory(Plugin *this,string_view dir)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_18 [8];
  string_view dir_local;
  
  dir_local._M_len = dir._M_len;
  local_18 = (undefined1  [8])this;
  std::__cxx11::string::operator=
            ((string *)&plugin_configs_directory_abi_cxx11_,
             (basic_string_view<char,_std::char_traits<char>_> *)local_18);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&plugin_configs_directory_abi_cxx11_);
  if (!bVar1) {
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                       (&plugin_configs_directory_abi_cxx11_);
    if (*pvVar2 != '/') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (&plugin_configs_directory_abi_cxx11_,'/');
    }
  }
  return;
}

Assistant:

void Jupiter::Plugin::setConfigDirectory(std::string_view dir) {
	plugin_configs_directory = dir;
	if (!plugin_configs_directory.empty() && plugin_configs_directory.back() != directory_character) {
		plugin_configs_directory += directory_character;
	}
}